

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O1

void install_trivial_crash_handlers(ThreadedReplayer *replayer)

{
  sigaction act;
  sigaction local_a8;
  
  global_replayer = replayer;
  memset(&local_a8,0,0x98);
  sigemptyset(&local_a8.sa_mask);
  local_a8.__sigaction_handler.sa_handler = crash_handler_trivial;
  local_a8.sa_flags = -0x80000000;
  sigaction(0xb,&local_a8,(sigaction *)0x0);
  sigaction(8,&local_a8,(sigaction *)0x0);
  sigaction(4,&local_a8,(sigaction *)0x0);
  sigaction(7,&local_a8,(sigaction *)0x0);
  sigaction(6,&local_a8,(sigaction *)0x0);
  return;
}

Assistant:

static void install_trivial_crash_handlers(ThreadedReplayer &replayer)
{
	global_replayer = &replayer;

	struct sigaction act;
	memset(&act, 0, sizeof(act));
	sigemptyset(&act.sa_mask);
	act.sa_handler = crash_handler_trivial;
	act.sa_flags = SA_RESETHAND;

	sigaction(SIGSEGV, &act, nullptr);
	sigaction(SIGFPE, &act, nullptr);
	sigaction(SIGILL, &act, nullptr);
	sigaction(SIGBUS, &act, nullptr);
	sigaction(SIGABRT, &act, nullptr);
}